

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O3

exception exception_create_const(char *message,char *label,int64_t code,char *stacktrace)

{
  exception __ptr;
  size_t sVar1;
  char *__dest;
  char *__dest_00;
  char *__dest_01;
  uint64_t uVar2;
  
  __ptr = (exception)malloc(0x30);
  if (__ptr == (exception)0x0) {
    return (exception)0x0;
  }
  if (message == (char *)0x0) {
    __ptr->message = (char *)0x0;
    __dest = (char *)0x0;
  }
  else {
    sVar1 = strlen(message);
    __dest = (char *)malloc(sVar1 + 1);
    __ptr->message = __dest;
    if (__dest == (char *)0x0) goto LAB_00108d95;
    memcpy(__dest,message,sVar1 + 1);
  }
  if (label == (char *)0x0) {
    __ptr->label = (char *)0x0;
    __dest_00 = (char *)0x0;
LAB_00108d28:
    if (stacktrace == (char *)0x0) {
      __ptr->stacktrace = (char *)0x0;
LAB_00108d64:
      __ptr->code = code;
      uVar2 = thread_id_get_current();
      __ptr->id = uVar2;
      LOCK();
      (__ptr->ref).count = 0;
      UNLOCK();
      LOCK();
      exception_stats.allocations = exception_stats.allocations + 1;
      UNLOCK();
      return __ptr;
    }
    sVar1 = strlen(stacktrace);
    __dest_01 = (char *)malloc(sVar1 + 1);
    __ptr->stacktrace = __dest_01;
    if (__dest_01 != (char *)0x0) {
      memcpy(__dest_01,stacktrace,sVar1 + 1);
      goto LAB_00108d64;
    }
    free(__dest_00);
  }
  else {
    sVar1 = strlen(label);
    __dest_00 = (char *)malloc(sVar1 + 1);
    __ptr->label = __dest_00;
    if (__dest_00 != (char *)0x0) {
      memcpy(__dest_00,label,sVar1 + 1);
      goto LAB_00108d28;
    }
  }
  free(__dest);
LAB_00108d95:
  free(__ptr);
  return (exception)0x0;
}

Assistant:

exception exception_create_const(const char *message, const char *label, int64_t code, const char *stacktrace)
{
	exception ex = malloc(sizeof(struct exception_type));

	if (ex == NULL)
	{
		goto exception_bad_alloc;
	}

	if (message != NULL)
	{
		size_t message_size = strlen(message) + 1;

		ex->message = malloc(sizeof(char) * message_size);

		if (ex->message == NULL)
		{
			goto message_bad_alloc;
		}

		memcpy(ex->message, message, message_size);
	}
	else
	{
		ex->message = NULL;
	}

	if (label != NULL)
	{
		size_t label_size = strlen(label) + 1;

		ex->label = malloc(sizeof(char) * label_size);

		if (ex->label == NULL)
		{
			goto label_bad_alloc;
		}

		memcpy(ex->label, label, label_size);
	}
	else
	{
		ex->label = NULL;
	}

	if (stacktrace != NULL)
	{
		size_t stacktrace_size = strlen(stacktrace) + 1;

		ex->stacktrace = malloc(sizeof(char) * stacktrace_size);

		if (ex->stacktrace == NULL)
		{
			goto stacktrace_bad_alloc;
		}

		memcpy(ex->stacktrace, stacktrace, stacktrace_size);
	}
	else
	{
		ex->stacktrace = NULL;
	}

	ex->code = code;
	ex->id = thread_id_get_current();

	threading_atomic_ref_count_initialize(&ex->ref);

	reflect_memory_tracker_allocation(exception_stats);

	return ex;

stacktrace_bad_alloc:
	free(ex->label);
label_bad_alloc:
	free(ex->message);
message_bad_alloc:
	free(ex);
exception_bad_alloc:
	return NULL;
}